

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O1

token * dmrC_tokenize_buffer(dmr_C *C,uchar *buffer,unsigned_long size,token **endtoken)

{
  token *ptVar1;
  token *ptVar2;
  stream_t local_60;
  
  local_60.size = (int)size;
  local_60.whitespace = 0;
  local_60.pos = 0;
  local_60.line = 1;
  local_60.nr = 0;
  local_60.newline = 1;
  local_60.token = (token *)0x0;
  local_60.fd = -1;
  local_60.offset = 0;
  local_60.buffer = buffer;
  ptVar1 = (token *)dmrC_allocator_allocate(&C->token_allocator,0);
  ptVar1->pos = (position)0x100100012;
  local_60.tokenlist = &ptVar1->next;
  ptVar2 = tokenize_stream(C,&local_60);
  *endtoken = ptVar2;
  return ptVar1;
}

Assistant:

struct token *dmrC_tokenize_buffer(struct dmr_C *C, unsigned char *buffer,
			      unsigned long size, struct token **endtoken)
{
	stream_t stream;
	struct token *begin;

	begin = setup_stream(C, &stream, 0, -1, buffer, size);
	*endtoken = tokenize_stream(C, &stream);
	return begin;
}